

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

bool Js::DynamicTypeHandler::CheckHeuristicsForFixedDataProps
               (DynamicObject *instance,PropertyRecord *propertyRecord,PropertyId propertyId,
               Var value)

{
  Var value_local;
  PropertyId propertyId_local;
  PropertyRecord *propertyRecord_local;
  DynamicObject *instance_local;
  
  if (propertyRecord == (PropertyRecord *)0x0) {
    instance_local._7_1_ = CheckHeuristicsForFixedDataProps(instance,propertyId,value);
  }
  else {
    instance_local._7_1_ = CheckHeuristicsForFixedDataProps(instance,propertyRecord,value);
  }
  return instance_local._7_1_;
}

Assistant:

bool DynamicTypeHandler::CheckHeuristicsForFixedDataProps(DynamicObject* instance, const PropertyRecord * propertyRecord, PropertyId propertyId, Var value)
    {
        if(propertyRecord)
        {
            return CheckHeuristicsForFixedDataProps(instance, propertyRecord, value);
        }
        else
        {
            return CheckHeuristicsForFixedDataProps(instance,propertyId,value);
        }
    }